

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O2

bool __thiscall
utilmm::config_set::get<bool>(config_set *this,string *name,bool *defval,type *enabler)

{
  undefined1 uVar1;
  list<bool,_std::allocator<bool>_> deflist;
  _List_base<bool,_std::allocator<bool>_> local_40;
  _List_base<bool,_std::allocator<bool>_> local_28;
  
  local_40._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_40;
  local_40._M_impl._M_node._M_size = 0;
  local_40._M_impl._M_node.super__List_node_base._M_prev =
       local_40._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::list<bool,_std::allocator<bool>_>::push_back
            ((list<bool,_std::allocator<bool>_> *)
             local_40._M_impl._M_node.super__List_node_base._M_next,defval);
  get<std::__cxx11::list<bool,std::allocator<bool>>>
            ((list<bool,_std::allocator<bool>_> *)&local_28,this,name,
             (list<bool,_std::allocator<bool>_> *)&local_40,(type *)0x0);
  uVar1 = *(undefined1 *)&local_28._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear(&local_28);
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear(&local_40);
  return (bool)uVar1;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::disable_if< details::is_list<T> >::type *enabler) const
    {
        std::list<T> deflist;
        deflist.push_back(defval);
        return get< std::list<T> >(name, deflist).front();
    }